

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O0

void __thiscall
CCommandProcessorFragment_OpenGL::Cmd_Render
          (CCommandProcessorFragment_OpenGL *this,CRenderCommand *pCommand)

{
  uint *in_RSI;
  CState *in_RDI;
  CCommandProcessorFragment_OpenGL *unaff_retaddr;
  
  SetState(unaff_retaddr,in_RDI);
  glVertexPointer(2,0x1406,0x24,*(undefined8 *)(in_RSI + 0x16));
  glTexCoordPointer(3,0x1406,0x24,*(long *)(in_RSI + 0x16) + 8);
  glColorPointer(4,0x1406,0x24,*(long *)(in_RSI + 0x16) + 0x14);
  glEnableClientState(0x8074);
  glEnableClientState(0x8078);
  glEnableClientState(0x8076);
  if (in_RSI[0x13] == 1) {
    glDrawArrays(1,0,in_RSI[0x14] << 1);
  }
  else if (in_RSI[0x13] == 2) {
    glDrawArrays(7,0,in_RSI[0x14] << 2);
  }
  else {
    dbg_msg("render","unknown primtype %d\n",(ulong)*in_RSI);
  }
  return;
}

Assistant:

void CCommandProcessorFragment_OpenGL::Cmd_Render(const CCommandBuffer::CRenderCommand *pCommand)
{
	SetState(pCommand->m_State);

	glVertexPointer(2, GL_FLOAT, sizeof(CCommandBuffer::CVertex), (char*)pCommand->m_pVertices);
	glTexCoordPointer(3, GL_FLOAT, sizeof(CCommandBuffer::CVertex), (char*)pCommand->m_pVertices + sizeof(float)*2);
	glColorPointer(4, GL_FLOAT, sizeof(CCommandBuffer::CVertex), (char*)pCommand->m_pVertices + sizeof(float)*5);
	glEnableClientState(GL_VERTEX_ARRAY);
	glEnableClientState(GL_TEXTURE_COORD_ARRAY);
	glEnableClientState(GL_COLOR_ARRAY);

	switch(pCommand->m_PrimType)
	{
	case CCommandBuffer::PRIMTYPE_QUADS:
		glDrawArrays(GL_QUADS, 0, pCommand->m_PrimCount*4);
		break;
	case CCommandBuffer::PRIMTYPE_LINES:
		glDrawArrays(GL_LINES, 0, pCommand->m_PrimCount*2);
		break;
	default:
		dbg_msg("render", "unknown primtype %d\n", pCommand->m_Cmd);
	};
}